

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O2

void __thiscall
VectorSUnitTest_element_access_front_back_Test::VectorSUnitTest_element_access_front_back_Test
          (VectorSUnitTest_element_access_front_back_Test *this)

{
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0016a060;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, element_access_front_back)
{
    vector_s<unsigned, 4> v{1u,2u,3u,4u};
    EXPECT_EQ(1u, v.front());
    EXPECT_EQ(4u, v.back());

    // const variant of front()/back()
    const vector_s<unsigned, 4> vc{1u,2u,3u,4u};
    EXPECT_EQ(1u, vc.front());
    EXPECT_EQ(4u, vc.back());
}